

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

Expr str_len(pExecutor exec,pContext_conflict defContext,pContext_conflict callContext,Expr *args,
            int argc)

{
  _Bool _Var1;
  char *__s;
  Expr EVar2;
  Expr EVar3;
  Expr expr;
  Expr ptr;
  Expr expr_00;
  
  if (argc < 1) {
    __s = "str-len: too few arguments";
  }
  else if (argc == 1) {
    EVar2._4_4_ = 0;
    EVar2.type = args->type;
    EVar2.field_1.val_atom = (args->field_1).val_atom;
    EVar2 = exec_eval(exec,callContext,EVar2);
    expr._4_4_ = 0;
    expr.type = EVar2.type;
    expr.field_1.val_atom = EVar2.field_1.val_atom;
    _Var1 = is_string(expr);
    if (_Var1) {
      ptr._4_4_ = 0;
      ptr.type = EVar2.type;
      ptr.field_1.val_atom = EVar2.field_1.val_atom;
      EVar2 = dereference(ptr);
      EVar2 = make_int_from_long(exec,(EVar2.field_1.val_str)->len);
      EVar3.field_1 = EVar2.field_1;
      EVar3.type = EVar2.type;
      expr_00._4_4_ = 0;
      expr_00.type = EVar3.type;
      expr_00.field_1.val_atom = EVar3.field_1.val_atom;
      _Var1 = is_none(expr_00);
      if (!_Var1) {
        EVar3._4_4_ = 0;
        return EVar3;
      }
      __s = "str-len: make_int_from_long failed";
    }
    else {
      __s = "str-len: argument `string` not a string";
    }
  }
  else {
    __s = "str-len: too many arguments";
  }
  puts(__s);
  exit(1);
}

Assistant:

BUILTIN_FUNC(str_len)
{
    if (argc < 1)
    {
        log("str-len: too few arguments");
        exit(1);
    }
    if (argc > 1)
    {
        log("str-len: too many arguments");
        exit(1);
    }
    Expr str_arg = exec_eval(exec, callContext, args[0]);
    if (!is_string(str_arg))
    {
        log("str-len: argument `string` not a string");
        exit(1);
    }
    pString str = dereference(str_arg).val_str;

    Expr res = make_int_from_long(exec, str->len);
    if (is_none(res))
    {
        log("str-len: make_int_from_long failed");
        exit(1);
    }
    return res;
}